

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,ImageSupport *this,OperationContext *context,Resource *resource)

{
  ImageImplementation *pIVar1;
  DefaultDeleter<vkt::synchronization::Operation> local_36;
  DefaultDeleter<vkt::synchronization::Operation> local_35 [13];
  Resource *local_28;
  Resource *resource_local;
  OperationContext *context_local;
  ImageSupport *this_local;
  
  local_28 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  this_local = (ImageSupport *)__return_storage_ptr__;
  if ((this->m_stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
    pIVar1 = (ImageImplementation *)operator_new(0x110);
    ImageImplementation::ImageImplementation
              (pIVar1,(OperationContext *)resource_local,local_28,this->m_stage,
               &this->m_shaderPrefix,this->m_mode,PIPELINE_TYPE_GRAPHICS,this->m_dispatchCall);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(&local_36);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,pIVar1);
  }
  else {
    pIVar1 = (ImageImplementation *)operator_new(0x110);
    ImageImplementation::ImageImplementation
              (pIVar1,(OperationContext *)resource_local,local_28,this->m_stage,
               &this->m_shaderPrefix,this->m_mode,PIPELINE_TYPE_COMPUTE,this->m_dispatchCall);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(local_35);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,pIVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_stage & VK_SHADER_STAGE_COMPUTE_BIT)
			return de::MovePtr<Operation>(new ImageImplementation(context, resource, m_stage, m_shaderPrefix, m_mode, PIPELINE_TYPE_COMPUTE, m_dispatchCall));
		else
			return de::MovePtr<Operation>(new ImageImplementation(context, resource, m_stage, m_shaderPrefix, m_mode, PIPELINE_TYPE_GRAPHICS, m_dispatchCall));
	}